

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH64_hash_t
XXH3_hashLong_64b_withSeed(void *input,size_t len,XXH64_hash_t seed,xxh_u8 *secret,size_t secretLen)

{
  long lVar1;
  long lVar2;
  XXH64_hash_t XVar3;
  XXH3_f_accumulate in_R9;
  xxh_u8 secret_1 [192];
  xxh_u64 acc [8];
  long lStackY_120;
  XXH3_f_scrambleAcc in_stack_fffffffffffffee8;
  xxh_u8 local_10d [181];
  xxh_u64 local_58 [9];
  
  lVar2 = 8;
  do {
    lVar1 = *(long *)(XXH3_kSecret + lVar2);
    *(XXH64_hash_t *)((long)&lStackY_120 + lVar2) = *(long *)(&UNK_0010a438 + lVar2) + seed;
    *(XXH64_hash_t *)(&stack0xfffffffffffffee8 + lVar2) = lVar1 - seed;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 200);
  local_58[6] = 0x27d4eb2f165667c5;
  local_58[7] = 0x9e3779b1;
  local_58[4] = 0x85ebca77c2b2ae63;
  local_58[5] = 0x85ebca77;
  local_58[2] = 0xc2b2ae3d27d4eb4f;
  local_58[3] = 0x165667b19e3779f9;
  local_58[0] = 0xc2b2ae3d;
  local_58[1] = 0x9e3779b185ebca87;
  lStackY_120 = 0x1054c4;
  XXH3_hashLong_internal_loop
            (local_58,(xxh_u8 *)input,len,&stack0xfffffffffffffee8,0xc0,in_R9,
             in_stack_fffffffffffffee8);
  lStackY_120 = 0x1054df;
  XVar3 = XXH3_mergeAccs(local_58,local_10d,len * -0x61c8864e7a143579);
  return XVar3;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t
XXH3_hashLong_64b_withSeed(const void* XXH_RESTRICT input, size_t len,
                           XXH64_hash_t seed, const xxh_u8* XXH_RESTRICT secret, size_t secretLen)
{
    (void)secret; (void)secretLen;
    return XXH3_hashLong_64b_withSeed_internal(input, len, seed,
                XXH3_accumulate, XXH3_scrambleAcc, XXH3_initCustomSecret);
}